

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCDPP_MPI.h
# Opt level: O0

value_type_conflict1 __thiscall
CCDPP_MPI::update_rating
          (CCDPP_MPI *this,
          unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
          *_R,value_type_conflict1 *_q4d,value_type_conflict1 *_global_p4d,int start_q_id,
          int workload,bool add)

{
  bool bVar1;
  size_type sVar2;
  size_type __n;
  reference pdVar3;
  function0<void> *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  byte in_stack_00000008;
  double l;
  iterator __end1;
  iterator __begin1;
  vector<double,_std::allocator<double>_> *__range1;
  value_type_conflict1 total_loss;
  int thread_index;
  value_type_conflict1 flag;
  vector<double,_std::allocator<double>_> loss;
  int size;
  task_type *in_stack_fffffffffffffe88;
  thread_pool<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
  *in_stack_fffffffffffffe90;
  allocator_type *in_stack_fffffffffffffe98;
  vector<double,_std::allocator<double>_> *this_00;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_138;
  undefined1 *local_130;
  double local_128;
  type tVar4;
  _Bind<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Hui_Li[P]CCDPP_alg_CCDPP_MPI_h:85:45)_(int)>
  *f;
  function0<void> *this_01;
  int local_74;
  vector<double,_std::allocator<double>_> local_51;
  undefined4 local_30;
  byte local_29;
  function0<void> *local_10;
  
  local_29 = in_stack_00000008 & 1;
  local_10 = in_RSI;
  sVar2 = std::
          unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
          ::size((unordered_map<int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>_>
                  *)0x196521);
  local_30 = (undefined4)sVar2;
  __n = (size_type)
        *(int *)((long)in_RDI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish + 0x24);
  local_51.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._1_8_
       = 0;
  this_00 = &local_51;
  std::allocator<double>::allocator((allocator<double> *)0x19655b);
  std::vector<double,_std::allocator<double>_>::vector
            (this_00,__n,(value_type_conflict1 *)in_RDI,in_stack_fffffffffffffe98);
  std::allocator<double>::~allocator((allocator<double> *)0x196589);
  for (local_74 = 0;
      local_74 <
      *(int *)((long)in_RDI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 0x24); local_74 = local_74 + 1) {
    tVar4 = (type)((ulong)&stack0xffffffffffffffd8 >> 0x20);
    f = (_Bind<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Hui_Li[P]CCDPP_alg_CCDPP_MPI_h:85:45)_(int)>
         *)&stack0xffffffffffffffd0;
    this_01 = local_10;
    std::
    bind<CCDPP_MPI::update_rating(std::unordered_map<int,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>>>&,double*,double*,int,int,bool)::_lambda(int)_1_,int&>
              ((anon_class_64_8_84fa0618_for__M_f *)
               (in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start,(int *)in_stack_fffffffffffffe90);
    boost::function0<void>::
    function0<std::_Bind<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Hui_Li[P]CCDPP_alg_CCDPP_MPI_h:85:45)_(int)>_>
              (this_01,f,tVar4);
    boost::threadpool::
    thread_pool<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
    ::schedule(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    boost::function0<void>::~function0((function0<void> *)0x1966a5);
  }
  boost::threadpool::
  thread_pool<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
  ::wait((thread_pool<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
          *)(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start,(void *)0x0);
  local_128 = 0.0;
  local_130 = (undefined1 *)
              ((long)&local_51.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1);
  local_138._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::begin
                 ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe88);
  std::vector<double,_std::allocator<double>_>::end
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe88);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                             *)in_stack_fffffffffffffe90,
                            (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                             *)in_stack_fffffffffffffe88), bVar1) {
    pdVar3 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&local_138);
    local_128 = *pdVar3 + local_128;
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&local_138);
  }
  std::vector<double,_std::allocator<double>_>::~vector(in_RDI);
  return local_128;
}

Assistant:

inline value_type update_rating(unordered_map<int, vector<pair<int, value_type > > > &_R, value_type *_q4d, value_type *_global_p4d,
                  const int start_q_id, const int workload, bool add) {

        int size = _R.size();

        vector<value_type> loss(parameter->num_of_thread, 0);

        value_type flag = add ? 1 : -1;

        for(int thread_index=0;thread_index<parameter->num_of_thread;thread_index++){
            thread_pool->schedule(std::bind([&](const int thread_index) {
                int start = workload * thread_index;
                int end = std::min(workload + start, size);

                for (int q_index = start; q_index < end; q_index++) {
                    vector<pair<int, value_type > > &vec = _R[q_index + start_q_id];
                    for (int i = 0; i < vec.size(); i++) {
                        pair<int, value_type > &p =  vec[i];
                        p.second += flag * _q4d[q_index] * _global_p4d[p.first];
                        loss[thread_index] += p.second * p.second;
                    }
                }
            }, thread_index));
        }

        thread_pool->wait();

        value_type total_loss = 0;
        for (auto l:loss) {
            total_loss += l;
        }
        return total_loss;
    }